

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.cpp
# Opt level: O2

void __thiscall
dg::llvmdg::SDGDependenciesBuilder::addControlDep
          (SDGDependenciesBuilder *this,DepDGElement *elem,Value *on)

{
  DGBBlock *nd;
  DGBBlock *pDVar1;
  DepDGElement *nd_00;
  DepDGElement *nd_01;
  _Rb_tree_node_base *p_Var2;
  
  if ((on == (Value *)0x0) || (on[0x10] != (Value)0x15)) {
    pDVar1 = (DGBBlock *)SystemDependenceGraph::getNode(this->_sdg,on);
    nd = (DGBBlock *)0x0;
    if (1 < *(int *)&(pDVar1->super_DepDGElement).field_0xc) {
      nd = pDVar1;
    }
    if (nd != (DGBBlock *)0x0 && *(int *)&(nd->super_DepDGElement).field_0xc == 6) {
      nd_00 = *(DepDGElement **)
               ((long)&nd[1].super_DepDGElement._use_deps.
                       super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t._M_impl.
                       super__Rb_tree_header + 8);
      if (nd_00 == (DepDGElement *)0x0) {
        nd_00 = (DepDGElement *)dg::sdg::DGParameters::createNoReturn();
      }
      sdg::DepDGElement::addControlDep(elem,nd_00);
      for (p_Var2 = *(_Rb_tree_node_base **)&nd[1].super_DepDGElement.field_0x8;
          p_Var2 != (_Rb_tree_node_base *)
                    &(nd->_nodes).
                     super__Vector_base<dg::sdg::DGNode_*,_std::allocator<dg::sdg::DGNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        nd_01 = *(DepDGElement **)(*(long *)(p_Var2 + 1) + 0x18);
        if (nd_01 == (DepDGElement *)0x0) {
          nd_01 = (DepDGElement *)dg::sdg::DGParameters::createNoReturn();
        }
        sdg::DepDGElement::addControlDep(nd_00,nd_01);
      }
      return;
    }
  }
  else {
    nd = SystemDependenceGraph::getBBlock(this->_sdg,(BasicBlock *)on);
  }
  sdg::DepDGElement::addControlDep(elem,&nd->super_DepDGElement);
  return;
}

Assistant:

void addControlDep(sdg::DepDGElement *elem, const llvm::Value *on) {
        if (const auto *depB = llvm::dyn_cast<llvm::BasicBlock>(on)) {
            auto *depblock = _sdg.getBBlock(depB);
            assert(depblock && "Do not have the block");
            elem->addControlDep(*depblock);
        } else {
            auto *depnd = sdg::DepDGElement::get(_sdg.getNode(on));
            assert(depnd && "Do not have the node");

            if (auto *C = sdg::DGNodeCall::get(depnd)) {
                // this is 'noret' dependence (we have no other control deps for
                // calls)
                auto *noret = C->getParameters().getNoReturn();
                if (!noret)
                    noret = &C->getParameters().createNoReturn();
                elem->addControlDep(*noret);

                // add CD to all formal norets
                for (auto *calledF : C->getCallees()) {
                    auto *fnoret = calledF->getParameters().getNoReturn();
                    if (!fnoret)
                        fnoret = &calledF->getParameters().createNoReturn();
                    noret->addControlDep(*fnoret);
                }
            } else {
                elem->addControlDep(*depnd);
            }
        }
    }